

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

ON_wString __thiscall
ON_FileSystemPath::RemoveFileName(ON_FileSystemPath *this,wchar_t *path,ON_wString *file_name)

{
  wchar_t *path_00;
  int local_7c;
  size_t length;
  wchar_t *fname;
  wchar_t *dir;
  wchar_t *vol;
  ON_wString local_28;
  ON_wString local_path;
  ON_wString *file_name_local;
  wchar_t *path_local;
  
  local_path.m_s = (wchar_t *)file_name;
  CleanPath((wchar_t *)&local_28);
  path_00 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  dir = (wchar_t *)0x0;
  fname = (wchar_t *)0x0;
  length = 0;
  on_wsplitpath(path_00,&dir,&fname,(wchar_t **)&length,(wchar_t **)0x0);
  if (((length == 0) || (path_00 == (wchar_t *)0x0)) || (length < path_00)) {
    local_7c = ON_wString::Length(&local_28);
  }
  else {
    local_7c = (int)((long)(length - (long)path_00) >> 2);
  }
  if (local_path.m_s != (wchar_t *)0x0) {
    ON_wString::operator=((ON_wString *)local_path.m_s,(wchar_t *)length);
  }
  ON_wString::ON_wString((ON_wString *)this,path_00,local_7c);
  ON_wString::~ON_wString(&local_28);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::RemoveFileName(
  const wchar_t* path,
  ON_wString* file_name
)
{
  const ON_wString local_path = ON_FileSystemPath::CleanPath(path);
  path = static_cast<const wchar_t*>(local_path);
  const wchar_t* vol = nullptr;
  const wchar_t* dir = nullptr;
  const wchar_t* fname = nullptr;
  on_wsplitpath(path, &vol, &dir, &fname, nullptr);
  
  const size_t length
    = (nullptr != fname && nullptr != path && path <= fname)
    ? (int)(fname - path)
    : local_path.Length();

  if (nullptr != file_name)
    *file_name = fname;

  return ON_wString(path,(int)length);
}